

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetStaticLibraryLinkOptions
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language)

{
  string_view arg;
  bool bVar1;
  string *this_00;
  type entry_00;
  EvaluatedTargetPropertyEntry local_260;
  cmListFileBacktrace local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1f0;
  undefined1 local_1c0 [8];
  unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
  entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *option;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_188 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string local_168;
  cmValue local_148;
  cmValue linkOptions;
  EvaluatedTargetPropertyEntries entries;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueOptions;
  string *language_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *result;
  
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dagChecker.CheckResult);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"STATIC_LIBRARY_OPTIONS",&local_109);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_e8,this,&local_108,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  anon_unknown.dwarf_e13ea5::EvaluatedTargetPropertyEntries::EvaluatedTargetPropertyEntries
            ((EvaluatedTargetPropertyEntries *)&linkOptions);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"STATIC_LIBRARY_OPTIONS",
             (allocator<char> *)
             ((long)&options.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_148 = GetProperty(this,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&options.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar1 = cmValue::operator_cast_to_bool(&local_148);
  if (bVar1) {
    this_00 = cmValue::operator*[abi_cxx11_(&local_148);
    arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_188,arg,false);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_188);
    option = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_188);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&option), bVar1) {
      entry._M_t.
      super___uniq_ptr_impl<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
      .super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
      std::__cxx11::string::string
                ((string *)&local_210,
                 (string *)
                 entry._M_t.
                 super___uniq_ptr_impl<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                 .super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>.
                 _M_head_impl);
      local_228.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_228.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_228);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_1f0,&local_210,&local_228);
      CreateTargetPropertyEntry
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1c0,SUB81(&local_1f0,0));
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_1f0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_228);
      std::__cxx11::string::~string((string *)&local_210);
      entry_00 = std::
                 unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                 ::operator*((unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                              *)local_1c0);
      anon_unknown.dwarf_e13ea5::EvaluateTargetPropertyEntry
                (&local_260,this,config,language,(cmGeneratorExpressionDAGChecker *)local_e8,
                 entry_00);
      std::
      vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                ((vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                  *)&linkOptions,&local_260);
      anon_unknown.dwarf_e13ea5::EvaluatedTargetPropertyEntry::~EvaluatedTargetPropertyEntry
                (&local_260);
      std::
      unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
      ::~unique_ptr((unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                     *)local_1c0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_188);
  }
  anon_unknown.dwarf_e13ea5::processOptions
            (this,(EvaluatedTargetPropertyEntries *)&linkOptions,__return_storage_ptr__,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&dagChecker.CheckResult,false,"static library link options",Shell,false);
  anon_unknown.dwarf_e13ea5::EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
            ((EvaluatedTargetPropertyEntries *)&linkOptions);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_e8);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&dagChecker.CheckResult);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetStaticLibraryLinkOptions(
  std::string const& config, std::string const& language) const
{
  std::vector<BT<std::string>> result;
  std::unordered_set<std::string> uniqueOptions;

  cmGeneratorExpressionDAGChecker dagChecker(this, "STATIC_LIBRARY_OPTIONS",
                                             nullptr, nullptr);

  EvaluatedTargetPropertyEntries entries;
  if (cmValue linkOptions = this->GetProperty("STATIC_LIBRARY_OPTIONS")) {
    std::vector<std::string> options = cmExpandedList(*linkOptions);
    for (const auto& option : options) {
      std::unique_ptr<TargetPropertyEntry> entry =
        CreateTargetPropertyEntry(option);
      entries.Entries.emplace_back(EvaluateTargetPropertyEntry(
        this, config, language, &dagChecker, *entry));
    }
  }
  processOptions(this, entries, result, uniqueOptions, false,
                 "static library link options", OptionsParse::Shell);

  return result;
}